

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSelect
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Select *curr,
          optional<wasm::Type> type)

{
  bool bVar1;
  Expression **ppEVar2;
  Type *pTVar3;
  Type local_40;
  uintptr_t local_38;
  uintptr_t local_30;
  Select *local_28;
  Select *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::Type> type_local;
  
  this_local = type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
  type_local.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id._0_1_ =
       type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  local_28 = curr;
  curr_local = (Select *)this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar1) {
    ppEVar2 = &local_28->ifTrue;
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    local_30 = pTVar3->id;
    note(this,ppEVar2,(Type)local_30);
    ppEVar2 = &local_28->ifFalse;
    pTVar3 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)&this_local);
    local_38 = pTVar3->id;
    note(this,ppEVar2,(Type)local_38);
  }
  else {
    noteAny(this,&local_28->ifTrue);
    noteAny(this,&local_28->ifFalse);
  }
  ppEVar2 = &local_28->condition;
  wasm::Type::Type(&local_40,i32);
  note(this,ppEVar2,local_40);
  return;
}

Assistant:

void visitSelect(Select* curr, std::optional<Type> type = std::nullopt) {
    if (type) {
      note(&curr->ifTrue, *type);
      note(&curr->ifFalse, *type);
    } else {
      noteAny(&curr->ifTrue);
      noteAny(&curr->ifFalse);
    }
    note(&curr->condition, Type::i32);
  }